

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::HlslParseContext::flatten
          (HlslParseContext *this,TVariable *variable,bool linkage,bool arrayed)

{
  ushort uVar1;
  undefined8 type_00;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  undefined4 extraout_var_00;
  long lVar4;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_00;
  size_type sVar5;
  pointer ppVar6;
  undefined4 extraout_var_01;
  TQualifier *pTVar7;
  TArraySizes *builtInArraySizes;
  undefined4 extraout_var_02;
  __enable_if_t<is_constructible<value_type,_pair<long_long,_TFlattenData>_>::value,_pair<iterator,_bool>_>
  _Var8;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_1a8;
  undefined1 local_180 [8];
  TType dereferencedType;
  TFlattenData local_d8;
  longlong local_90;
  pair<long_long,_glslang::HlslParseContext::TFlattenData> local_88;
  _Rb_tree_iterator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_> local_38;
  __enable_if_t<is_constructible<value_type,_pair<long_long,_TFlattenData>_>::value,_pair<iterator,_bool>_>
  entry;
  TType *type;
  bool arrayed_local;
  bool linkage_local;
  TVariable *variable_local;
  HlslParseContext *this_local;
  
  iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xc])();
  entry._8_8_ = CONCAT44(extraout_var,iVar2);
  uVar3 = (**(code **)(*(long *)entry._8_8_ + 0x148))();
  if (((uVar3 & 1) == 0) ||
     (uVar3 = (**(code **)(*(long *)entry._8_8_ + 0x128))(), (uVar3 & 1) != 0)) {
    iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[0xf])();
    local_90 = CONCAT44(extraout_var_00,iVar2);
    lVar4 = (**(code **)(*(long *)entry._8_8_ + 0x58))();
    uVar1 = *(ushort *)(lVar4 + 0x20);
    lVar4 = (**(code **)(*(long *)entry._8_8_ + 0x58))();
    TFlattenData::TFlattenData(&local_d8,(uint)uVar1,*(uint *)(lVar4 + 0x1c) & 0xfff);
    std::make_pair<long_long,glslang::HlslParseContext::TFlattenData>(&local_88,&local_90,&local_d8)
    ;
    _Var8 = std::
            map<long_long,glslang::HlslParseContext::TFlattenData,std::less<long_long>,glslang::pool_allocator<std::pair<long_long_const,glslang::HlslParseContext::TFlattenData>>>
            ::insert<std::pair<long_long,glslang::HlslParseContext::TFlattenData>>
                      ((map<long_long,glslang::HlslParseContext::TFlattenData,std::less<long_long>,glslang::pool_allocator<std::pair<long_long_const,glslang::HlslParseContext::TFlattenData>>>
                        *)&this->flattenMap,&local_88);
    dereferencedType.spirvType = (TSpirvType *)_Var8.first._M_node;
    entry.first._M_node._0_1_ = _Var8.second;
    local_38._M_node = (_Base_ptr)dereferencedType.spirvType;
    std::pair<long_long,_glslang::HlslParseContext::TFlattenData>::~pair(&local_88);
    TFlattenData::~TFlattenData(&local_d8);
    uVar3 = (**(code **)(*(long *)entry._8_8_ + 0x128))();
    if ((uVar3 & 1) != 0) {
      this_00 = &TType::getStruct((TType *)entry._8_8_)->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
      sVar5 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                        (this_00);
      if (sVar5 == 0) {
        return;
      }
    }
    type_00 = entry._8_8_;
    if (arrayed) {
      TType::TType((TType *)local_180,(TType *)entry._8_8_,0,false);
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>
               ::operator->(&local_38);
      iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[3])();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      basic_string(&local_1a8,
                   (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   CONCAT44(extraout_var_01,iVar2));
      pTVar7 = (TQualifier *)(**(code **)(*(long *)entry._8_8_ + 0x58))();
      builtInArraySizes = (TArraySizes *)(**(code **)(*(long *)entry._8_8_ + 0x98))();
      flatten(this,variable,(TType *)local_180,&ppVar6->second,&local_1a8,linkage,pTVar7,
              builtInArraySizes);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_1a8);
      TType::~TType((TType *)local_180);
    }
    else {
      ppVar6 = std::
               _Rb_tree_iterator<std::pair<const_long_long,_glslang::HlslParseContext::TFlattenData>_>
               ::operator->(&local_38);
      iVar2 = (*(variable->super_TSymbol)._vptr_TSymbol[3])();
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      basic_string(&local_1d0,
                   (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   CONCAT44(extraout_var_02,iVar2));
      pTVar7 = (TQualifier *)(**(code **)(*(long *)entry._8_8_ + 0x58))();
      flatten(this,variable,(TType *)type_00,&ppVar6->second,&local_1d0,linkage,pTVar7,
              (TArraySizes *)0x0);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_1d0);
    }
  }
  return;
}

Assistant:

void HlslParseContext::flatten(const TVariable& variable, bool linkage, bool arrayed)
{
    const TType& type = variable.getType();

    // If it's a standalone built-in, there is nothing to flatten
    if (type.isBuiltIn() && !type.isStruct())
        return;


    auto entry = flattenMap.insert(std::make_pair(variable.getUniqueId(),
                                                  TFlattenData(type.getQualifier().layoutBinding,
                                                               type.getQualifier().layoutLocation)));

    if (type.isStruct() && type.getStruct()->size()==0)
        return;
    // if flattening arrayed io struct, array each member of dereferenced type
    if (arrayed) {
        const TType dereferencedType(type, 0);
        flatten(variable, dereferencedType, entry.first->second, variable.getName(), linkage,
                type.getQualifier(), type.getArraySizes());
    } else {
        flatten(variable, type, entry.first->second, variable.getName(), linkage,
                type.getQualifier(), nullptr);
    }
}